

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O0

int run_test_tcp6_local_connect_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_30 [4];
  int r;
  sockaddr_in6 addr;
  
  iVar1 = is_supported_system();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","Unsupported system");
    fflush(_stderr);
    addr.sin6_addr.__in6_u.__u6_addr32[3] = 7;
  }
  else {
    iVar1 = can_ipv6();
    if (iVar1 == 0) {
      fprintf(_stderr,"%s\n","IPv6 not supported");
      fflush(_stderr);
      addr.sin6_addr.__in6_u.__u6_addr32[3] = 7;
    }
    else {
      iVar1 = uv_ip6_addr("::1",9999,local_30);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0xab,"uv_ip6_addr(\"::1\", 9999, &addr)","==","0",(long)iVar1,"==",0);
        abort();
      }
      uVar2 = uv_default_loop();
      iVar1 = uv_timer_init(uVar2,&timer);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0xae,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0xb2,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      uVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(uVar2,&conn);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,0xb5,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_tcp_connect(&connect_req,&conn,local_30,connect_local_cb);
      if (iVar1 == -0x65) {
        fprintf(_stderr,"%s\n","Network unreachable.");
        fflush(_stderr);
        addr.sin6_addr.__in6_u.__u6_addr32[3] = 7;
      }
      else {
        if ((long)iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                  ,0xbd,"r","==","0",(long)iVar1,"==",0);
          abort();
        }
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if ((long)iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                  ,0xc0,"r","==","0",(long)iVar1,"==",0);
          abort();
        }
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if ((long)iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                  ,0xc2,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
          abort();
        }
        uv_library_shutdown();
        addr.sin6_addr.__in6_u.__u6_addr32[3] = 0;
      }
    }
  }
  return addr.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

TEST_IMPL(tcp6_local_connect_timeout) {
  struct sockaddr_in6 addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  if (!can_ipv6()) {
    RETURN_SKIP("IPv6 not supported");
  }

  ASSERT_OK(uv_ip6_addr("::1", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}